

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage,bool ms_and_1d,
          bool subroutine)

{
  ostream *poVar1;
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [48];
  undefined1 local_198 [8];
  ostringstream os;
  bool subroutine_local;
  bool ms_and_1d_local;
  int stage_local;
  ImageSizeMachine *this_local;
  
  os._370_1_ = subroutine;
  os._371_1_ = ms_and_1d;
  os._372_4_ = stage;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"#version 430 core");
  if (os._372_4_ == 4) {
    std::operator<<((ostream *)local_198,"\n#extension GL_ARB_compute_shader : require");
  }
  std::operator<<((ostream *)local_198,
                  "\nlayout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;");
  if ((os._371_1_ & 1) == 0) {
    poVar1 = std::operator<<((ostream *)local_198,"\nlayout(binding = 1, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_1c8);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_1e8);
    poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(binding = 2, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_208);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_228);
    poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(binding = 3, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_248);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_268);
    poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(binding = 4, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_288);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_2a8);
    poVar1 = std::operator<<(poVar1,"imageCubeArray g_image_cube_array;\nlayout(binding = 5, rgba32"
                            );
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_2c8);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_2e8);
    poVar1 = std::operator<<(poVar1,"image2DRect g_image_rect;\nlayout(binding = 6, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_308);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_328);
    poVar1 = std::operator<<(poVar1,"image2DArray g_image_2d_array;\nlayout(binding = 7, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_348);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_368);
    std::operator<<(poVar1,"imageBuffer g_image_buffer;");
    std::__cxx11::string::~string(local_368);
    std::__cxx11::string::~string(local_348);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_2c8);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1c8);
  }
  else {
    poVar1 = std::operator<<((ostream *)local_198,"\nlayout(binding = 1, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_388);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_3a8);
    poVar1 = std::operator<<(poVar1,"image1D g_image_1d;\nlayout(binding = 2, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_3c8);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_3e8);
    poVar1 = std::operator<<(poVar1,"image1DArray g_image_1d_array;\nlayout(binding = 3, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_408);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_428);
    poVar1 = std::operator<<(poVar1,"image2DMS g_image_2dms;\nlayout(binding = 4, rgba32");
    ImageFormatPostfix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_448);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<float,4>>();
    poVar1 = std::operator<<(poVar1,local_468);
    std::operator<<(poVar1,"image2DMSArray g_image_2dms_array;");
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_3e8);
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_388);
  }
  if ((os._370_1_ & 1) != 0) {
    std::operator<<((ostream *)local_198,
                    "\nsubroutine void FuncType(int coord);\nsubroutine uniform FuncType g_func;");
  }
  if (os._372_4_ == 0) {
    std::operator<<((ostream *)local_198,"\nvoid main() {\n  int coord = gl_VertexID;");
  }
  else if (os._372_4_ == 1) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(vertices = 1) out;\nvoid main() {\n  gl_TessLevelInner[0] = 1;\n  gl_TessLevelInner[1] = 1;\n  gl_TessLevelOuter[0] = 1;\n  gl_TessLevelOuter[1] = 1;\n  gl_TessLevelOuter[2] = 1;\n  gl_TessLevelOuter[3] = 1;\n  int coord = gl_PrimitiveID;"
                   );
  }
  else if (os._372_4_ == 2) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(quads, point_mode) in;\nvoid main() {\n  int coord = gl_PrimitiveID;")
    ;
  }
  else if (os._372_4_ == 3) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nvoid main() {\n  int coord = gl_PrimitiveIDIn;"
                   );
  }
  else if (os._372_4_ == 4) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);"
                   );
  }
  else if (os._372_4_ == 5) {
    std::operator<<((ostream *)local_198,"\nvoid main() {\n  int coord = gl_PrimitiveID;");
  }
  if ((os._370_1_ & 1) != 0) {
    std::operator<<((ostream *)local_198,
                    "\n  g_func(coord);\n}\nsubroutine(FuncType) void Func0(int coord) {");
  }
  if ((os._371_1_ & 1) == 0) {
    std::operator<<((ostream *)local_198,
                    "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));\n}"
                   );
  }
  else {
    std::operator<<((ostream *)local_198,
                    "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(0));\n}"
                   );
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage, bool ms_and_1d, bool subroutine)
	{
		std::ostringstream os;
		os << "#version 430 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;";
		if (ms_and_1d == false)
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2D g_image_2d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image3D g_image_3d;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "imageCube g_image_cube;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "imageCubeArray g_image_cube_array;" NL "layout(binding = 5, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DRect g_image_rect;" NL "layout(binding = 6, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;" NL "layout(binding = 7, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>() << "imageBuffer g_image_buffer;";
		}
		else
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image1D g_image_1d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image1DArray g_image_1d_array;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DMS g_image_2dms;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DMSArray g_image_2dms_array;";
		}
		if (subroutine)
		{
			os << NL "subroutine void FuncType(int coord);" NL "subroutine uniform FuncType g_func;";
		}
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  int coord = gl_PrimitiveIDIn;";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		if (subroutine)
		{
			os << NL "  g_func(coord);" NL "}" NL "subroutine(FuncType) void Func0(int coord) {";
		}
		if (ms_and_1d == false)
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));" NL "}";
		}
		else
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(0));" NL "}";
		}
		return os.str();
	}